

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_z.c
# Opt level: O0

void test_option_z(void)

{
  wchar_t wVar1;
  char *pcVar2;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  char *in_stack_00000010;
  void *in_stack_00000018;
  size_t s;
  void *in_stack_00000028;
  int r;
  char *p;
  char *in_stack_00000038;
  size_t in_stack_00000050;
  char *in_stack_00000058;
  void *in_stack_00000060;
  void *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  longlong in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  wchar_t in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  char *in_stack_fffffffffffffff8;
  
  assertion_make_file(in_stack_00000008,unaff_retaddr_00,in_stack_fffffffffffffff8,
                      in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8)
  ;
  wVar1 = systemf("%s -zcf archive.out f 2>archive.err",testprog);
  pcVar2 = slurpfile((size_t *)&stack0xffffffffffffffe8,"archive.err");
  pcVar2[(long)in_stack_ffffffffffffffe8] = '\0';
  if (wVar1 == L'\0') {
    slurpfile((size_t *)&stack0xffffffffffffffe8,"archive.out");
    assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffc8);
    assertion_equal_mem(in_stack_00000038,p._4_4_,in_stack_00000028,(char *)s,in_stack_00000018,
                        in_stack_00000010,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  }
  else {
    wVar1 = canGzip();
    if (wVar1 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_z.c"
                     ,L',');
      test_skipping("gzip is not supported on this platform");
    }
    else {
      failure("-z option is broken");
      assertion_equal_int(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                          in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,0,(char *)0x116b54,
                          (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_z)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with gzip compression. */
	r = systemf("%s -zcf archive.out f 2>archive.err", testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (!canGzip()) {
			skipping("gzip is not supported on this platform");
			return;
		}
		failure("-z option is broken");
		assertEqualInt(r, 0);
		return;
	}
	/* Check that the archive file has a gzip signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 4);
	assertEqualMem(p, "\x1f\x8b\x08\x00", 4);
}